

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O0

void __thiscall Disk::flip_sides(Disk *this)

{
  bool bVar1;
  reference ppVar2;
  mapped_type *this_00;
  key_type local_130;
  CylHead cylhead;
  undefined1 local_118 [8];
  pair<const_CylHead,_TrackData> pair;
  iterator __end1;
  iterator __begin1;
  map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
  *__range1;
  map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
  trackdata;
  Disk *this_local;
  
  trackdata._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
  ::map((map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
         *)&__range1);
  __end1 = std::
           map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
           ::begin(&this->m_trackdata);
  pair.second._176_8_ =
       std::
       map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
       ::end(&this->m_trackdata);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&pair.second.m_normalised_flux);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_CylHead,_TrackData>_>::operator*(&__end1);
    std::pair<const_CylHead,_TrackData>::pair((pair<const_CylHead,_TrackData> *)local_118,ppVar2);
    local_130 = (key_type)((ulong)local_118 ^ 0x100000000);
    this_00 = std::
              map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
              ::operator[]((map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
                            *)&__range1,&local_130);
    TrackData::operator=(this_00,(TrackData *)&pair);
    std::pair<const_CylHead,_TrackData>::~pair((pair<const_CylHead,_TrackData> *)local_118);
    std::_Rb_tree_iterator<std::pair<const_CylHead,_TrackData>_>::operator++(&__end1);
  }
  std::swap<CylHead,TrackData,std::less<CylHead>,std::allocator<std::pair<CylHead_const,TrackData>>>
            ((map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
              *)&__range1,&this->m_trackdata);
  std::
  map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
  ::~map((map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
          *)&__range1);
  return;
}

Assistant:

void Disk::flip_sides()
{
    decltype(m_trackdata) trackdata;

    for (auto pair : m_trackdata)
    {
        CylHead cylhead = pair.first;
        cylhead.head ^= 1;

        // Move tracks to the new head position
        trackdata[cylhead] = std::move(pair.second);
    }

    // Finally, swap the gutted container with the new one
    std::swap(trackdata, m_trackdata);
}